

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DataDeclarationSyntax *args_2;
  CheckerDataDeclarationSyntax *pCVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000078;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000080;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  args_2 = (DataDeclarationSyntax *)
           deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000080,in_stack_00000078);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::DataDeclarationSyntax_*>::operator*
            ((not_null<slang::syntax::DataDeclarationSyntax_*> *)0x7b16fb);
  deepClone<slang::syntax::DataDeclarationSyntax>
            ((DataDeclarationSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CheckerDataDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataDeclarationSyntax&>
                     (this,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,
                      TVar2._0_8_,args_2);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CheckerDataDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CheckerDataDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.rand.deepClone(alloc),
        *deepClone<DataDeclarationSyntax>(*node.data, alloc)
    );
}